

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patomic-sync.c
# Opt level: O0

ppointer p_atomic_pointer_get(void *atomic)

{
  void *atomic_local;
  
  return *atomic;
}

Assistant:

P_LIB_API ppointer
p_atomic_pointer_get (const volatile void *atomic)
{
#ifdef P_CC_CRAY
	__builtin_ia32_mfence ();
#else
	__sync_synchronize ();
#endif
	return (ppointer) *((const volatile psize *) atomic);
}